

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execution-results.h
# Opt level: O2

FunctionResult * __thiscall
wasm::ExecutionResults::run
          (FunctionResult *__return_storage_ptr__,ExecutionResults *this,Function *func,Module *wasm
          ,ModuleRunner *instance)

{
  string_view name;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar1;
  char cVar2;
  ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator> PVar3;
  SmallVector<wasm::Literal,_1UL> local_110;
  SmallVector<wasm::Literal,_1UL> local_d8;
  Type local_a0;
  undefined1 auStack_98 [8];
  Literals arguments;
  undefined1 local_48 [8];
  Iterator __begin2;
  
  arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].type.id = 0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.i64 = 0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems[0].field_0.func.super_IString.str.
  _M_str = (char *)0x0;
  auStack_98 = (undefined1  [8])0x0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.usedFixed = 0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
  super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)func;
  __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index =
       (size_t)__return_storage_ptr__;
  local_a0.id = ::wasm::HeapType::getSignature();
  local_48 = (undefined1  [8])&local_a0;
  __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent = (Type *)0x0;
  PVar3 = (ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>)Type::end((Type *)local_48)
  ;
  do {
    PVar1.index = (size_t)__begin2.
                          super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
    ;
    PVar1.parent = (Type *)local_48;
    if (PVar3 == PVar1) {
      name = ((arguments.super_SmallVector<wasm::Literal,_1UL>.flexible.
               super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage)->field_0).func.super_IString.str;
      SmallVector<wasm::Literal,_1UL>::SmallVector
                (&local_110,(SmallVector<wasm::Literal,_1UL> *)auStack_98);
      ModuleRunnerBase<wasm::ModuleRunner>::callFunction
                ((Literals *)&local_d8,&instance->super_ModuleRunnerBase<wasm::ModuleRunner>,
                 (Name)name,(Literals *)&local_110);
      std::__detail::__variant::
      _Variant_storage<false,wasm::Literals,wasm::ExecutionResults::Trap,wasm::ExecutionResults::Exception>
      ::_Variant_storage<0ul,wasm::Literals>
                ((_Variant_storage<false,wasm::Literals,wasm::ExecutionResults::Trap,wasm::ExecutionResults::Exception>
                  *)__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.
                    index,&local_d8);
      SmallVector<wasm::Literal,_1UL>::~SmallVector(&local_d8);
      SmallVector<wasm::Literal,_1UL>::~SmallVector(&local_110);
LAB_001bcc6f:
      SmallVector<wasm::Literal,_1UL>::~SmallVector((SmallVector<wasm::Literal,_1UL> *)auStack_98);
      return (FunctionResult *)
             __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index;
    }
    ::wasm::Type::Iterator::operator*((Iterator *)local_48);
    cVar2 = ::wasm::Type::isDefaultable();
    if (cVar2 == '\0') {
      std::operator<<((ostream *)&std::cout,
                      "[trap fuzzer can only send defaultable parameters to exports]\n");
      *(undefined1 *)
       (__begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.index + 0x38) =
           1;
      goto LAB_001bcc6f;
    }
    ::wasm::Literal::makeZero((Type)&local_d8);
    SmallVector<wasm::Literal,_1UL>::push_back
              ((SmallVector<wasm::Literal,_1UL> *)auStack_98,(Literal *)&local_d8);
    ::wasm::Literal::~Literal((Literal *)&local_d8);
    __begin2.super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent =
         (Type *)((long)&(__begin2.
                          super_ParentIndexIterator<const_wasm::Type_*,_wasm::Type::Iterator>.parent
                         )->id + 1);
  } while( true );
}

Assistant:

FunctionResult run(Function* func, Module& wasm, ModuleRunner& instance) {
    try {
      // call the method
      Literals arguments;
      for (const auto& param : func->getParams()) {
        // zeros in arguments TODO: more?
        if (!param.isDefaultable()) {
          std::cout << "[trap fuzzer can only send defaultable parameters to "
                       "exports]\n";
          return Trap{};
        }
        arguments.push_back(Literal::makeZero(param));
      }
      return instance.callFunction(func->name, arguments);
    } catch (const TrapException&) {
      return Trap{};
    } catch (const WasmException& e) {
      std::cout << "[exception thrown: " << e << "]" << std::endl;
      return Exception{};
    } catch (const HostLimitException&) {
      // This should be ignored and not compared with, as optimizations can
      // change whether a host limit is reached.
      ignore = true;
      return {};
    }
  }